

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O2

void __thiscall Assimp::IFCImporter::SetupProperties(IFCImporter *this,Importer *pImp)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ai_real aVar4;
  float fVar5;
  float fVar6;
  
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_IFC_SKIP_SPACE_REPRESENTATIONS",true);
  (this->settings).skipSpaceRepresentations = bVar1;
  bVar1 = Importer::GetPropertyBool(pImp,"IMPORT_IFC_CUSTOM_TRIANGULATION",true);
  (this->settings).useCustomTriangulation = bVar1;
  aVar4 = Importer::GetPropertyFloat(pImp,"IMPORT_IFC_SMOOTHING_ANGLE",10.0);
  fVar6 = 5.0;
  if (5.0 <= aVar4) {
    fVar6 = aVar4;
  }
  fVar5 = 120.0;
  if (fVar6 <= 120.0) {
    fVar5 = fVar6;
  }
  (this->settings).conicSamplingAngle = fVar5;
  iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_IFC_CYLINDRICAL_TESSELLATION",0x20);
  iVar3 = 3;
  if (3 < iVar2) {
    iVar3 = iVar2;
  }
  if (0xb3 < iVar3) {
    iVar3 = 0xb4;
  }
  (this->settings).cylindricalTessellation = iVar3;
  (this->settings).skipAnnotations = true;
  return;
}

Assistant:

void IFCImporter::SetupProperties(const Importer* pImp)
{
    settings.skipSpaceRepresentations = pImp->GetPropertyBool(AI_CONFIG_IMPORT_IFC_SKIP_SPACE_REPRESENTATIONS,true);
    settings.useCustomTriangulation = pImp->GetPropertyBool(AI_CONFIG_IMPORT_IFC_CUSTOM_TRIANGULATION,true);
    settings.conicSamplingAngle = std::min(std::max((float) pImp->GetPropertyFloat(AI_CONFIG_IMPORT_IFC_SMOOTHING_ANGLE, AI_IMPORT_IFC_DEFAULT_SMOOTHING_ANGLE), 5.0f), 120.0f);
	settings.cylindricalTessellation = std::min(std::max(pImp->GetPropertyInteger(AI_CONFIG_IMPORT_IFC_CYLINDRICAL_TESSELLATION, AI_IMPORT_IFC_DEFAULT_CYLINDRICAL_TESSELLATION), 3), 180);
	settings.skipAnnotations = true;
}